

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_AddTxOut_RemoveTxOut_Test::TestBody(Transaction_AddTxOut_RemoveTxOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  AssertHelper local_538;
  Message local_530 [2];
  CfdException *anon_var_0;
  byte local_4c9;
  char *pcStack_4c8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_4b8;
  int local_4b0;
  uint local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_8;
  Message local_490;
  AssertHelper local_488;
  Message local_480;
  AssertHelper local_478;
  Message local_470;
  long local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined8 local_450;
  undefined1 local_448;
  long local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_7;
  Message local_420;
  TxOutReference local_418 [80];
  AssertHelper local_3c8;
  Message local_3c0;
  TxOutReference txout_ref;
  Amount amt2;
  AssertHelper local_348;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  Message local_318;
  uint local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_5;
  Message local_2f0;
  size_type local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_4;
  Message local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_list;
  Message local_280;
  undefined4 local_278;
  uint local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  TxOutReference local_250 [80];
  AssertHelper local_200;
  Message local_1f8;
  int local_1f0;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  _func_int **local_1c8;
  undefined1 local_1c0;
  undefined1 local_1b8 [48];
  AssertionResult gtest_ar_1;
  Message local_178;
  TxOutReference local_170 [80];
  AssertHelper local_120;
  Message local_118;
  int local_110;
  uint local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  Message local_f0 [2];
  _func_int **local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [40];
  string local_a8 [32];
  undefined1 local_88 [8];
  Script script;
  Transaction tx;
  Transaction_AddTxOut_RemoveTxOut_Test *this_local;
  
  cfd::core::Transaction::Transaction
            ((Transaction *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,"76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac",
             (allocator *)(local_d0 + 0x27));
  cfd::core::Script::Script((Script *)local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d0 + 0x27));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e0 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_d8 = extraout_DL;
      local_d0._0_8_ = local_e0;
      local_d0[8] = extraout_DL;
      cfd::core::Transaction::AddTxOut
                ((Amount *)
                 &script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_d0);
    }
  }
  else {
    testing::Message::Message(local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17d,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_f0);
  }
  local_10c = cfd::core::Transaction::GetTxOutCount();
  local_110 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_108,"tx.GetTxOutCount()","1",&local_10c,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)local_170);
      cfd::core::TxOutReference::~TxOutReference(local_170);
    }
  }
  else {
    testing::Message::Message(&local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x17f,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_178);
  }
  local_1b8._36_4_ = 0;
  local_1b8._32_4_ =
       cfd::core::Transaction::GetTxOutIndex
                 ((Script *)
                  &script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_1b8 + 0x28,"0",(int *)"tx.GetTxOutIndex(script)",(uint *)(local_1b8 + 0x24),
             local_1b8 + 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1b8 + 0x28));
  if (!bVar1) {
    testing::Message::Message((Message *)(local_1b8 + 0x18));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1b8 + 0x28));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_1b8 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_1b8 + 0x10),(Message *)(local_1b8 + 0x18));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_1b8 + 0x10));
    testing::Message::~Message((Message *)(local_1b8 + 0x18));
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1b8 + 0x28));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1c8 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(100000);
      local_1c0 = extraout_DL_00;
      local_1b8._0_8_ = local_1c8;
      local_1b8[8] = extraout_DL_00;
      cfd::core::Transaction::AddTxOut
                ((Amount *)
                 &script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_1b8);
    }
  }
  else {
    testing::Message::Message(&local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x182,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d0);
  }
  local_1ec = cfd::core::Transaction::GetTxOutCount();
  local_1f0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1e8,"tx.GetTxOutCount()","2",&local_1ec,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)local_250);
      cfd::core::TxOutReference::~TxOutReference(local_250);
    }
  }
  else {
    testing::Message::Message(&local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x184,"Expected: tx.GetTxOut(1) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  local_274 = 0;
  local_278 = cfd::core::Transaction::GetTxOutIndex
                        ((Script *)
                         &script.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_270,"0",(int *)"tx.GetTxOutIndex(script)",&local_274,&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_280);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd60);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOutIndexList((Script *)&stack0xfffffffffffffd48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd60,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd48);
    }
  }
  else {
    testing::Message::Message(&local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x187,
               "Expected: (index_list = tx.GetTxOutIndexList(script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2c0);
  }
  local_2dc = 2;
  local_2e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &stack0xfffffffffffffd60);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_2d8,"2","index_list.size()",&local_2dc,&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x188,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd60
                    );
  if (sVar3 == 2) {
    local_30c = 0;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xfffffffffffffd60,0);
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              (local_308,"0",(int *)"index_list[0]",&local_30c,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    local_334 = 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xfffffffffffffd60,1);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_330,"1","index_list[1]",&local_334,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar1) {
      testing::Message::Message(&local_340);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
                 ,0x18b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      testing::Message::~Message(&local_340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  }
  cfd::core::Amount::CreateBySatoshiAmount(0x74cbb1);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)&stack0xfffffffffffffc48);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetTxOutValue((int)&script + 0x30,(Amount *)0x1);
    }
  }
  else {
    testing::Message::Message(&local_3c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x191,
               "Expected: tx.SetTxOutValue(1, amt2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message(&local_3c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)local_418);
      cfd::core::TxOutReference::operator=((TxOutReference *)&stack0xfffffffffffffc48,local_418);
      cfd::core::TxOutReference::~TxOutReference(local_418);
    }
  }
  else {
    testing::Message::Message(&local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x192,
               "Expected: (txout_ref = tx.GetTxOut(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_420);
  }
  local_460 = cfd::core::AbstractTxOutReference::GetValue
                        ((AbstractTxOutReference *)&stack0xfffffffffffffc48);
  local_458 = extraout_DL_01;
  local_450 = local_460;
  local_448 = extraout_DL_01;
  local_440 = cfd::core::Amount::GetSatoshiValue();
  local_468 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_438,"txout_ref.GetValue().GetSatoshiValue()",
             "amt2.GetSatoshiValue()",&local_440,&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x194,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((int)&script + 0x30);
    }
  }
  else {
    testing::Message::Message(&local_480);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x196,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((int)&script + 0x30);
    }
  }
  else {
    testing::Message::Message(&local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x197,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_490);
  }
  local_4ac = cfd::core::Transaction::GetTxOutCount();
  local_4b0 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_4a8,"tx.GetTxOutCount()","0",&local_4ac,&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x198,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffb38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffb38);
  if (bVar1) {
    local_4c9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxOut((uint)&anon_var_0);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&anon_var_0);
    }
    if ((local_4c9 & 1) != 0) goto LAB_0029e005;
    pcStack_4c8 = 
    "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_530);
  testing::internal::AssertHelper::AssertHelper
            (&local_538,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x199,pcStack_4c8);
  testing::internal::AssertHelper::operator=(&local_538,local_530);
  testing::internal::AssertHelper::~AssertHelper(&local_538);
  testing::Message::~Message(local_530);
LAB_0029e005:
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&stack0xfffffffffffffc48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffd60);
  cfd::core::Script::~Script((Script *)local_88);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Transaction, AddTxOut_RemoveTxOut) {
  Transaction tx(exp_version, exp_locktime);
  Script script("76a9143f1f881ea0e079888a8a9d65025aacf6b98f853588ac");

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(tx.GetTxOut(0));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));

  EXPECT_NO_THROW(tx.AddTxOut(Amount::CreateBySatoshiAmount(100000), script));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW(tx.GetTxOut(1));
  EXPECT_EQ(0, tx.GetTxOutIndex(script));
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW((index_list = tx.GetTxOutIndexList(script)));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(1, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  TxOutReference txout_ref;
  EXPECT_NO_THROW(tx.SetTxOutValue(1, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(1)));
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(),
            amt2.GetSatoshiValue());

  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  EXPECT_THROW(tx.GetTxOut(0), CfdException);
}